

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O1

void __thiscall kratos::IfStmt::IfStmt(IfStmt *this,shared_ptr<kratos::Var> *predicate)

{
  _Rb_tree_header *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  element_type *peVar4;
  pointer ppVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  uint32_t width;
  int iVar7;
  undefined1 local_48 [16];
  element_type *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  
  (this->super_Stmt).super_enable_shared_from_this<kratos::Stmt>._M_weak_this.
  super___weak_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_Stmt).super_enable_shared_from_this<kratos::Stmt>._M_weak_this.
  super___weak_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Stmt).super_IRNode.fn_name_ln.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Stmt).super_IRNode.fn_name_ln.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->super_Stmt).super_IRNode.fn_name_ln.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->super_Stmt).super_IRNode.fn_name_ln.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->super_Stmt).super_IRNode.comment._M_dataplus._M_p =
       (pointer)&(this->super_Stmt).super_IRNode.comment.field_2;
  (this->super_Stmt).super_IRNode.comment._M_string_length = 0;
  (this->super_Stmt).super_IRNode.comment.field_2._M_local_buf[0] = '\0';
  (this->super_Stmt).super_IRNode.ast_node_type_ = StmtKind;
  (this->super_Stmt).super_IRNode.attributes_.
  super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Stmt).super_IRNode.attributes_.
  super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Stmt).super_IRNode.attributes_.
  super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Stmt).type_ = If;
  (this->super_Stmt).parent_ = (IRNode *)0x0;
  (this->super_Stmt).stmt_id_ = -1;
  p_Var1 = &(this->super_Stmt).scope_context_._M_t._M_impl.super__Rb_tree_header;
  (this->super_Stmt).scope_context_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->super_Stmt).scope_context_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->super_Stmt).scope_context_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->super_Stmt).scope_context_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->super_Stmt).scope_context_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_Stmt).super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_002b6ac0;
  (this->predicate_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (predicate->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->predicate_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (predicate->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (predicate->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->predicate_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  (predicate->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (this->else_body_).super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->else_body_).super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->then_body_).super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->then_body_).super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->predicate_stmt_).super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->predicate_stmt_).super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<kratos::ScopedStmtBlock,std::allocator<kratos::ScopedStmtBlock>>
            (&stack0xffffffffffffffd0,(ScopedStmtBlock **)&stack0xffffffffffffffc8,
             (allocator<kratos::ScopedStmtBlock> *)local_48);
  std::__shared_ptr<kratos::ScopedStmtBlock,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<kratos::ScopedStmtBlock,kratos::ScopedStmtBlock>
            ((__shared_ptr<kratos::ScopedStmtBlock,(__gnu_cxx::_Lock_policy)2> *)
             &stack0xffffffffffffffc8,(ScopedStmtBlock *)local_38);
  _Var6._M_pi = _Stack_30._M_pi;
  ppVar5 = (pointer)local_38;
  local_38 = (element_type *)0x0;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (this->then_body_).
           super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  (this->then_body_).super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)ppVar5;
  (this->then_body_).super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var6._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
  }
  local_38 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<kratos::ScopedStmtBlock,std::allocator<kratos::ScopedStmtBlock>>
            (&stack0xffffffffffffffd0,(ScopedStmtBlock **)&stack0xffffffffffffffc8,
             (allocator<kratos::ScopedStmtBlock> *)local_48);
  std::__shared_ptr<kratos::ScopedStmtBlock,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<kratos::ScopedStmtBlock,kratos::ScopedStmtBlock>
            ((__shared_ptr<kratos::ScopedStmtBlock,(__gnu_cxx::_Lock_policy)2> *)
             &stack0xffffffffffffffc8,(ScopedStmtBlock *)local_38);
  _Var6._M_pi = _Stack_30._M_pi;
  ppVar5 = (pointer)local_38;
  local_38 = (element_type *)0x0;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (this->else_body_).
           super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  (this->else_body_).super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)ppVar5;
  (this->else_body_).super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var6._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
  }
  peVar3 = (this->then_body_).
           super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar3->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[7])(peVar3,this);
  peVar3 = (this->else_body_).
           super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar3->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[7])(peVar3,this);
  width = (*(((this->predicate_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->super_IRNode)._vptr_IRNode[0xd])();
  iVar7 = (*(((this->predicate_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->super_IRNode)._vptr_IRNode[7])();
  Generator::get_auxiliary_var((Generator *)local_48,width,SUB41(iVar7,0));
  Var::assign((Var *)&stack0xffffffffffffffc8,(shared_ptr<kratos::Var> *)local_48._0_8_);
  _Var6._M_pi = _Stack_30._M_pi;
  peVar4 = local_38;
  local_38 = (element_type *)0x0;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (this->predicate_stmt_).
           super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->predicate_stmt_).super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar4;
  (this->predicate_stmt_).super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var6._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
  }
  if ((pointer)local_48._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
  }
  peVar4 = (this->predicate_stmt_).
           super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar4->super_Stmt).super_IRNode._vptr_IRNode[7])(peVar4,this);
  return;
}

Assistant:

IfStmt::IfStmt(std::shared_ptr<Var> predicate)
    : Stmt(StatementType::If), predicate_(::move(predicate)) {
    then_body_ = std::make_shared<ScopedStmtBlock>();
    else_body_ = std::make_shared<ScopedStmtBlock>();

    then_body_->set_parent(this);
    else_body_->set_parent(this);

    // just to add the sinks
    predicate_stmt_ =
        predicate_->generator()->get_auxiliary_var(predicate_->width())->assign(predicate_);
    predicate_stmt_->set_parent(this);
}